

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtCountOnesInCofsFast_rec(word *pTruth,int iVar,int nWords,int *pStore)

{
  int iVar1;
  int iVar2;
  int local_34;
  int i;
  int nMints1;
  int nMints0;
  int *pStore_local;
  int nWords_local;
  int iVar_local;
  word *pTruth_local;
  
  if (nWords == 1) {
    if (iVar != 5) {
      __assert_fail("iVar == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x217,"int Abc_TtCountOnesInCofsFast_rec(word *, int, int, int *)");
    }
    pTruth_local._4_4_ = Abc_TtCountOnesInCofsFast6_rec(*pTruth,5,8,pStore);
  }
  else {
    if (nWords < 2) {
      __assert_fail("nWords > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x21a,"int Abc_TtCountOnesInCofsFast_rec(word *, int, int, int *)");
    }
    if (iVar < 6) {
      __assert_fail("iVar > 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x21b,"int Abc_TtCountOnesInCofsFast_rec(word *, int, int, int *)");
    }
    if ((*pTruth & 1) == 0) {
      iVar1 = Abc_TtIsConst0(pTruth,nWords);
      if (iVar1 != 0) {
        return 0;
      }
    }
    else {
      iVar1 = Abc_TtIsConst1(pTruth,nWords);
      if (iVar1 != 0) {
        for (local_34 = 0; local_34 <= iVar; local_34 = local_34 + 1) {
          pStore[local_34] = nWords * 0x20 + pStore[local_34];
        }
        return nWords << 6;
      }
    }
    iVar1 = Abc_TtCountOnesInCofsFast_rec(pTruth,iVar + -1,nWords / 2,pStore);
    iVar2 = Abc_TtCountOnesInCofsFast_rec(pTruth + nWords / 2,iVar + -1,nWords / 2,pStore);
    pStore[iVar] = iVar1 + pStore[iVar];
    pTruth_local._4_4_ = iVar1 + iVar2;
  }
  return pTruth_local._4_4_;
}

Assistant:

int Abc_TtCountOnesInCofsFast_rec( word * pTruth, int iVar, int nWords, int * pStore )
{
    int nMints0, nMints1;
    if ( nWords == 1 )
    {
        assert( iVar == 5 );
        return Abc_TtCountOnesInCofsFast6_rec( pTruth[0], iVar, 8, pStore );
    }
    assert( nWords > 1 );
    assert( iVar > 5 );
    if ( pTruth[0] & 1 )
    {
        if ( Abc_TtIsConst1( pTruth, nWords ) )
        {
            int i;
            for ( i = 0; i <= iVar; i++ )
                pStore[i] += nWords * 32;
            return nWords * 64;
        }
    }
    else 
    {
        if ( Abc_TtIsConst0( pTruth, nWords ) )
            return 0;
    }
    nMints0 = Abc_TtCountOnesInCofsFast_rec( pTruth,            iVar - 1, nWords/2, pStore );
    nMints1 = Abc_TtCountOnesInCofsFast_rec( pTruth + nWords/2, iVar - 1, nWords/2, pStore );
    pStore[iVar] += nMints0;
    return nMints0 + nMints1;
}